

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catridge.h
# Opt level: O0

bool __thiscall Catridge::ppuRead(Catridge *this,uint16_t addr,uint8_t *data)

{
  uint uVar1;
  element_type *peVar2;
  const_reference pvVar3;
  bool bVar4;
  uint local_2c;
  uint8_t *puStack_28;
  uint32_t mappedAddr;
  uint8_t *data_local;
  Catridge *pCStack_18;
  uint16_t addr_local;
  Catridge *this_local;
  
  local_2c = 0;
  puStack_28 = data;
  data_local._6_2_ = addr;
  pCStack_18 = this;
  peVar2 = std::__shared_ptr_access<Mapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Mapper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->pMapper);
  uVar1 = (*peVar2->_vptr_Mapper[2])(peVar2,(ulong)data_local._6_2_,&local_2c,data_local._6_2_);
  bVar4 = (uVar1 & 1) != 0;
  if (bVar4) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->vCHRMemory,(ulong)local_2c);
    *puStack_28 = *pvVar3;
  }
  return bVar4;
}

Assistant:

bool ppuRead(uint16_t addr, uint8_t &data) const
  {
    uint32_t mappedAddr = 0;
    if (pMapper->ppuMapRead(addr, mappedAddr))
    {
      data = vCHRMemory[mappedAddr];
      return true;
    }
    return false;
  }